

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_container_unit.c
# Opt level: O0

int run_negation_range_tests
              (int k,int h,int start_offset,int r_start,int r_end,int expected_type,_Bool inplace,
              _Bool expected_actual_inplace)

{
  rle16_t vl;
  _Bool _Var1;
  int iVar2;
  run_container_t *run;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  int in_EDI;
  int in_R8D;
  byte in_stack_00000008;
  byte in_stack_00000010;
  int x_1;
  int result_card;
  uint8_t result_typecode;
  _Bool in_zone;
  int i;
  int actual_runlen;
  int offsetx;
  int x;
  int runlen;
  _Bool result_should_be [65536];
  int result_size_should_be;
  int returned_type;
  container_t *BO;
  run_container_t *RI;
  undefined4 in_stack_fffffffffffeff88;
  int in_stack_fffffffffffeff8c;
  uint in_stack_fffffffffffeff90;
  undefined2 uVar3;
  uint16_t pos;
  int iVar4;
  int iVar5;
  int in_stack_fffffffffffeffa0;
  uint uVar6;
  int in_stack_fffffffffffeffa4;
  undefined2 in_stack_fffffffffffeffa8;
  undefined1 in_stack_fffffffffffeffaa;
  byte in_stack_fffffffffffeffab;
  int iVar7;
  int in_stack_fffffffffffeffb8;
  int in_stack_fffffffffffeffbc;
  int range_end;
  run_container_t *in_stack_fffffffffffeffc8;
  
  uVar3 = (undefined2)in_ECX;
  pos = (uint16_t)((uint)in_ECX >> 0x10);
  iVar4 = in_EDX;
  iVar5 = in_ESI;
  run = run_container_create_given_capacity(in_stack_fffffffffffeff8c);
  _assert_true(CONCAT44(in_stack_fffffffffffeffa4,in_stack_fffffffffffeffa0),
               (char *)CONCAT44(iVar5,iVar4),
               (char *)CONCAT26(pos,CONCAT24(uVar3,in_stack_fffffffffffeff90)),
               in_stack_fffffffffffeff8c);
  iVar2 = in_ESI;
  for (range_end = 0; range_end < 0x10000 - in_EDX; range_end = range_end + 1) {
    in_stack_fffffffffffeffbc = range_end + in_EDX;
    if (range_end % in_EDI == 0) {
      in_stack_fffffffffffeffb8 = iVar2;
      if (0x10000 < in_stack_fffffffffffeffbc + iVar2) {
        in_stack_fffffffffffeffb8 = 0x10000 - in_stack_fffffffffffeffbc;
      }
      vl.length = (short)in_stack_fffffffffffeffb8 - 1;
      vl.value = (uint16_t)in_stack_fffffffffffeffbc;
      run_container_append_first(run,vl);
      iVar2 = iVar2 + 1;
      if (iVar2 == in_EDI) {
        iVar2 = in_ESI;
      }
    }
  }
  for (iVar7 = 0; iVar7 < 0x10000; iVar7 = iVar7 + 1) {
    uVar6 = in_stack_fffffffffffeff90 & 0xffffff;
    if (in_ECX <= iVar7) {
      uVar6 = CONCAT13(iVar7 < in_R8D,(int3)in_stack_fffffffffffeff90);
    }
    in_stack_fffffffffffeff90 = uVar6;
    in_stack_fffffffffffeffab = (byte)(in_stack_fffffffffffeff90 >> 0x18);
    _Var1 = run_container_contains((run_container_t *)CONCAT44(iVar5,iVar4),pos);
    if (_Var1 == (_Bool)(in_stack_fffffffffffeffab & 1)) {
      (&stack0xfffffffffffeffc8)[iVar7] = 0;
    }
    else {
      (&stack0xfffffffffffeffc8)[iVar7] = 1;
    }
  }
  if ((in_stack_00000008 & 1) == 0) {
    run_container_negation_range
              ((run_container_t *)
               CONCAT44(iVar7,CONCAT13(in_stack_fffffffffffeffab,
                                       CONCAT12(in_stack_fffffffffffeffaa,in_stack_fffffffffffeffa8)
                                      )),in_stack_fffffffffffeffa4,in_stack_fffffffffffeffa0,
               (container_t **)CONCAT44(iVar5,iVar4));
  }
  else {
    run_container_negation_range_inplace
              (in_stack_fffffffffffeffc8,iVar2,range_end,
               (container_t **)CONCAT44(in_stack_fffffffffffeffbc,in_stack_fffffffffffeffb8));
  }
  iVar2 = container_get_cardinality
                    ((container_t *)CONCAT44(in_stack_fffffffffffeff8c,in_stack_fffffffffffeff88),
                     '\0');
  _assert_int_equal(CONCAT44(iVar2,in_stack_fffffffffffeffa0),CONCAT44(iVar5,iVar4),
                    (char *)CONCAT26(pos,CONCAT24(uVar3,in_stack_fffffffffffeff90)),
                    in_stack_fffffffffffeff8c);
  if ((in_stack_00000010 & 1) == 0) {
    _assert_true(CONCAT44(iVar2,in_stack_fffffffffffeffa0),(char *)CONCAT44(iVar5,iVar4),
                 (char *)CONCAT26(pos,CONCAT24(uVar3,in_stack_fffffffffffeff90)),
                 in_stack_fffffffffffeff8c);
  }
  else {
    _assert_true(CONCAT44(iVar2,in_stack_fffffffffffeffa0),(char *)CONCAT44(iVar5,iVar4),
                 (char *)CONCAT26(pos,CONCAT24(uVar3,in_stack_fffffffffffeff90)),
                 in_stack_fffffffffffeff8c);
  }
  _assert_int_equal(CONCAT44(iVar2,in_stack_fffffffffffeffa0),CONCAT44(iVar5,iVar4),
                    (char *)CONCAT26(pos,CONCAT24(uVar3,in_stack_fffffffffffeff90)),
                    in_stack_fffffffffffeff8c);
  for (uVar6 = 0; (int)uVar6 < 0x10000; uVar6 = uVar6 + 1) {
    _Var1 = container_contains((container_t *)
                               CONCAT44(in_stack_fffffffffffeff8c,in_stack_fffffffffffeff88),0,'\0')
    ;
    if (_Var1 != (_Bool)((&stack0xfffffffffffeffc8)[(int)uVar6] & 1)) {
      printf("problem at index %d should be (but isnt) %d\n",(ulong)uVar6,
             (ulong)((&stack0xfffffffffffeffc8)[(int)uVar6] & 1));
    }
    container_contains((container_t *)CONCAT44(in_stack_fffffffffffeff8c,in_stack_fffffffffffeff88),
                       0,'\0');
    _assert_int_equal(CONCAT44(iVar2,uVar6),CONCAT44(iVar5,iVar4),
                      (char *)CONCAT26(pos,CONCAT24(uVar3,in_stack_fffffffffffeff90)),
                      in_stack_fffffffffffeff8c);
  }
  container_free((container_t *)CONCAT26(pos,CONCAT24(uVar3,in_stack_fffffffffffeff90)),
                 (uint8_t)((uint)in_stack_fffffffffffeff8c >> 0x18));
  if ((in_stack_00000008 & 1) == 0) {
    run_container_free((run_container_t *)0x109a36);
  }
  return 1;
}

Assistant:

static int run_negation_range_tests(int k, int h, int start_offset, int r_start,
                                    int r_end, int expected_type, bool inplace,
                                    bool expected_actual_inplace) {
    run_container_t* RI =
        run_container_create_given_capacity((1 << 16) / k + 1);
    container_t* BO;
    int returned_type;
    int result_size_should_be;
    bool result_should_be[1 << 16];

    assert_true(h <
                k);  // bad test call otherwise..not failure of code under test

    int runlen = h;
    for (int x = 0; x < (1 << 16) - start_offset; x++) {
        int offsetx = x + start_offset;
        if (x % k == 0) {
            int actual_runlen = runlen;
            if (offsetx + runlen > (1 << 16))
                actual_runlen = (1 << 16) - offsetx;

            // run_container_append does not dynamically increase its
            // array
            run_container_append_first(
                RI, CROARING_MAKE_RLE16(offsetx, actual_runlen - 1));
            if (++runlen == k) runlen = h;  // wrap after k-1 back to h.
        }
    }

    result_size_should_be = 0;

    for (int i = 0; i < (1 << 16); ++i) {
        bool in_zone = (i >= r_start && i < r_end);
        if (run_container_contains(RI, (uint16_t)i) ^ in_zone) {
            result_should_be[i] = true;
            ++result_size_should_be;
        } else
            result_should_be[i] = false;
    }
    if (inplace)
        returned_type =
            run_container_negation_range_inplace(RI, r_start, r_end, &BO);
    else
        returned_type = run_container_negation_range(RI, r_start, r_end, &BO);

    uint8_t result_typecode = (uint8_t)returned_type;

    int result_card = container_get_cardinality(BO, result_typecode);

    assert_int_equal(expected_type, returned_type);

    if (expected_actual_inplace) {
        assert_true(BO == RI);  // it really is inplace
    } else {
        assert_false(BO == RI);  // it better not be inplace
    }

    assert_int_equal(result_size_should_be, result_card);

    for (int x = 0; x < (1 << 16); x++) {
#ifndef UNVERBOSE_MIXED_CONTAINER
        if (container_contains(BO, (uint16_t)x, result_typecode) !=
            result_should_be[x])
            printf("problem at index %d should be (but isnt) %d\n", x,
                   (int)result_should_be[x]);
#endif
        assert_int_equal(container_contains(BO, (uint16_t)x, result_typecode),
                         result_should_be[x]);
    }
    // assert_int_equal(result_size_should_be, result_card);
    container_free(BO, result_typecode);
    if (!inplace) run_container_free(RI);
    // for inplace: input is either output, or it was already freed
    // internally

    return 1;
}